

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task.hpp
# Opt level: O3

Task * __thiscall
tf::Task::succeed<tf::Task&,tf::Task&,tf::Task&>(Task *this,Task *tasks,Task *tasks_1,Task *tasks_2)

{
  Node *pNVar1;
  size_t sVar2;
  void *pvVar3;
  void *pvVar4;
  undefined8 uVar5;
  Node *local_40;
  Node *local_38;
  
  pNVar1 = tasks->_node;
  local_38 = this->_node;
  SmallVectorTemplateBase<tf::Node_*,_true>::push_back
            ((SmallVectorTemplateBase<tf::Node_*,_true> *)&pNVar1->_edges,&local_38);
  sVar2 = pNVar1->_num_successors;
  pvVar3 = (pNVar1->_edges).super_SmallVectorImpl<tf::Node_*>.
           super_SmallVectorTemplateBase<tf::Node_*,_true>.
           super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
  pNVar1->_num_successors = sVar2 + 1;
  pvVar4 = (pNVar1->_edges).super_SmallVectorImpl<tf::Node_*>.
           super_SmallVectorTemplateBase<tf::Node_*,_true>.
           super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX;
  uVar5 = *(undefined8 *)((long)pvVar3 + sVar2 * 8);
  *(undefined8 *)((long)pvVar3 + sVar2 * 8) = *(undefined8 *)((long)pvVar4 + -8);
  *(undefined8 *)((long)pvVar4 + -8) = uVar5;
  local_40 = pNVar1;
  SmallVectorTemplateBase<tf::Node_*,_true>::push_back
            ((SmallVectorTemplateBase<tf::Node_*,_true> *)&local_38->_edges,&local_40);
  pNVar1 = tasks_1->_node;
  local_38 = this->_node;
  SmallVectorTemplateBase<tf::Node_*,_true>::push_back
            ((SmallVectorTemplateBase<tf::Node_*,_true> *)&pNVar1->_edges,&local_38);
  sVar2 = pNVar1->_num_successors;
  pvVar3 = (pNVar1->_edges).super_SmallVectorImpl<tf::Node_*>.
           super_SmallVectorTemplateBase<tf::Node_*,_true>.
           super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
  pNVar1->_num_successors = sVar2 + 1;
  pvVar4 = (pNVar1->_edges).super_SmallVectorImpl<tf::Node_*>.
           super_SmallVectorTemplateBase<tf::Node_*,_true>.
           super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX;
  uVar5 = *(undefined8 *)((long)pvVar3 + sVar2 * 8);
  *(undefined8 *)((long)pvVar3 + sVar2 * 8) = *(undefined8 *)((long)pvVar4 + -8);
  *(undefined8 *)((long)pvVar4 + -8) = uVar5;
  local_40 = pNVar1;
  SmallVectorTemplateBase<tf::Node_*,_true>::push_back
            ((SmallVectorTemplateBase<tf::Node_*,_true> *)&local_38->_edges,&local_40);
  pNVar1 = tasks_2->_node;
  local_38 = this->_node;
  SmallVectorTemplateBase<tf::Node_*,_true>::push_back
            ((SmallVectorTemplateBase<tf::Node_*,_true> *)&pNVar1->_edges,&local_38);
  sVar2 = pNVar1->_num_successors;
  pvVar3 = (pNVar1->_edges).super_SmallVectorImpl<tf::Node_*>.
           super_SmallVectorTemplateBase<tf::Node_*,_true>.
           super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
  pNVar1->_num_successors = sVar2 + 1;
  pvVar4 = (pNVar1->_edges).super_SmallVectorImpl<tf::Node_*>.
           super_SmallVectorTemplateBase<tf::Node_*,_true>.
           super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX;
  uVar5 = *(undefined8 *)((long)pvVar3 + sVar2 * 8);
  *(undefined8 *)((long)pvVar3 + sVar2 * 8) = *(undefined8 *)((long)pvVar4 + -8);
  *(undefined8 *)((long)pvVar4 + -8) = uVar5;
  local_40 = pNVar1;
  SmallVectorTemplateBase<tf::Node_*,_true>::push_back
            ((SmallVectorTemplateBase<tf::Node_*,_true> *)&local_38->_edges,&local_40);
  return this;
}

Assistant:

Task& Task::succeed(Ts&&... tasks) {
  (tasks._node->_precede(_node), ...);
  //_succeed(std::forward<Ts>(tasks)...);
  return *this;
}